

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O2

void __thiscall
fizplex::BaseTestRegularWithReordering_BackwardTransformDVector_Test::TestBody
          (BaseTestRegularWithReordering_BackwardTransformDVector_Test *this)

{
  Base *this_00;
  DVector *vec;
  DVector *vec_00;
  DVector *vec_01;
  char *pcVar1;
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  AssertionResult gtest_ar;
  DVector local_50;
  AssertHelper local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  this_00 = &(this->super_BaseTestRegularWithReordering).b;
  vec = &(this->super_BaseTestRegularWithReordering).dv0;
  Base::btran(this_00,vec);
  vec_00 = &(this->super_BaseTestRegularWithReordering).dv1;
  Base::btran(this_00,vec_00);
  vec_01 = &(this->super_BaseTestRegularWithReordering).dv2;
  Base::btran(this_00,vec_01);
  local_38.data_ = (AssertHelperData *)0xbf9cd85689039b0b;
  uStack_30 = 0x3fbcd85689039b0b;
  local_28 = 0xbfb2073615a240e7;
  l._M_len = 3;
  l._M_array = (iterator)&local_38;
  DVector::DVector(&local_50,l);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            ((internal *)&gtest_ar,"DVector({-2.0 / 71, 8.0 / 71, -5.0 / 71})","dv0",&local_50,vec);
  operator_delete(local_50.vals._M_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x77,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_38.data_ = (AssertHelperData *)0x3fcea5dbf193d4bb;
  uStack_30 = 0x3fa5a240e6c2b448;
  local_28 = 0x3fb93d4bb7e327a9;
  l_00._M_len = 3;
  l_00._M_array = (iterator)&local_38;
  DVector::DVector(&local_50,l_00);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            ((internal *)&gtest_ar,"DVector({17.0 / 71, 3.0 / 71, 7.0 / 71})","dv1",&local_50,vec_00
            );
  operator_delete(local_50.vals._M_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x78,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_38.data_ = (AssertHelperData *)0x3fe0ad12073615a2;
  uStack_30 = 0xbfb5a240e6c2b448;
  local_28 = 0xbfc93d4bb7e327a9;
  l_01._M_len = 3;
  l_01._M_array = (iterator)&local_38;
  DVector::DVector(&local_50,l_01);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            ((internal *)&gtest_ar,"DVector({37.0 / 71, -6.0 / 71, -14.0 / 71})","dv2",&local_50,
             vec_01);
  operator_delete(local_50.vals._M_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x79,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(BaseTestRegularWithReordering, BackwardTransformDVector) {
  b.btran(dv0);
  b.btran(dv1);
  b.btran(dv2);
  EXPECT_EQ(DVector({-2.0 / 71, 8.0 / 71, -5.0 / 71}), dv0);
  EXPECT_EQ(DVector({17.0 / 71, 3.0 / 71, 7.0 / 71}), dv1);
  EXPECT_EQ(DVector({37.0 / 71, -6.0 / 71, -14.0 / 71}), dv2);
}